

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

int __thiscall QMetaObjectBuilder::indexOfEnumerator(QMetaObjectBuilder *this,QByteArray *name)

{
  bool bVar1;
  reference lhs;
  reference pvVar2;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QMetaEnumBuilderPrivate *enumerator;
  vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_> *__range1;
  iterator __end1;
  iterator __begin1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>
  *in_stack_ffffffffffffffb0;
  int local_1c;
  __normal_iterator<QMetaEnumBuilderPrivate_*,_std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_current = (QMetaEnumBuilderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (QMetaEnumBuilderPrivate *)
       std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>::begin
                 (in_stack_ffffffffffffffb0);
  std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>::end
            (in_stack_ffffffffffffffb0);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<QMetaEnumBuilderPrivate_*,_std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<QMetaEnumBuilderPrivate_*,_std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) {
      local_1c = -1;
LAB_00374c59:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_1c;
      }
      __stack_chk_fail();
    }
    lhs = __gnu_cxx::
          __normal_iterator<QMetaEnumBuilderPrivate_*,_std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>_>
          ::operator*(&local_10);
    bVar1 = ::operator==(&lhs->name,in_RDI);
    if (bVar1) {
      pvVar2 = std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>::front
                         ((vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>
                           *)lhs);
      local_1c = (int)(((long)lhs - (long)pvVar2) / 0x70);
      goto LAB_00374c59;
    }
    __gnu_cxx::
    __normal_iterator<QMetaEnumBuilderPrivate_*,_std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>_>
    ::operator++(&local_10);
  } while( true );
}

Assistant:

int QMetaObjectBuilder::indexOfEnumerator(const QByteArray &name)
{
    for (const auto &enumerator : d->enumerators) {
        if (name == enumerator.name)
            return int(&enumerator - &d->enumerators.front());
    }
    return -1;
}